

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O0

UINT8 device_start_c140(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  byte bVar1;
  sbyte sVar2;
  int iVar3;
  DEV_DATA devData;
  uint local_2c;
  UINT8 s2;
  UINT8 s1;
  int i;
  c140_state *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x788);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(UINT32 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = cfg->clock;
    *(uint *)((long)devData.chipInf + 0xc) =
         *(uint *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf / 0x120;
    if ((cfg->srMode == '\x01') ||
       ((cfg->srMode == '\x02' && (*(uint *)((long)devData.chipInf + 0xc) < cfg->smplRate)))) {
      *(UINT32 *)((long)devData.chipInf + 0xc) = cfg->smplRate;
    }
    *(float *)&((DEV_DATA *)((long)devData.chipInf + 0x10))->chipInf =
         ((float)*(uint *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf / 288.0) /
         (float)*(uint *)((long)devData.chipInf + 0xc);
    *(UINT8 *)((long)devData.chipInf + 0x14) = cfg->flags;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0x18))->chipInf = 0;
    ((DEV_DATA *)((long)devData.chipInf + 0x20))->chipInf = (void *)0x0;
    for (local_2c = 0; (int)local_2c < 0x100; local_2c = local_2c + 1) {
      bVar1 = (byte)local_2c & 7;
      iVar3 = (int)(char)(byte)local_2c >> 3;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      *(ushort *)((long)devData.chipInf + (long)(int)local_2c * 2 + 0x228) =
           (ushort)(0x80 << bVar1) & 0xff00;
      if ((local_2c & 7) == 0) {
        sVar2 = 4;
      }
      else {
        sVar2 = bVar1 + 3;
      }
      *(ushort *)((long)devData.chipInf + (long)(int)local_2c * 2 + 0x228) =
           *(short *)((long)devData.chipInf + (long)(int)local_2c * 2 + 0x228) +
           ((ushort)((byte)iVar3 & 0x1f) << sVar2);
      if ((local_2c & 0x80) != 0) {
        *(short *)((long)devData.chipInf + (long)(int)local_2c * 2 + 0x228) =
             -*(short *)((long)devData.chipInf + (long)(int)local_2c * 2 + 0x228);
      }
    }
    c140_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,*(UINT32 *)((long)devData.chipInf + 0xc),
                &devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_c140(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	c140_state *info;
	int i;

	info = (c140_state *)calloc(1, sizeof(c140_state));
	if (info == NULL)
		return 0xFF;
	
	info->clock = cfg->clock;
	info->sample_rate = info->clock / 288;	// sample rate according to superctr
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->sample_rate, cfg->smplRate);
	info->pbase = (float)info->clock / 288.0f / (float)info->sample_rate;

	info->banking_type = cfg->flags;

	info->pRomSize = 0x00;
	info->pRom = NULL;

	for(i = 0; i < 256; i++)
	{
		UINT8 s1 = i & 7;
		UINT8 s2 = abs((INT8)i >> 3) & 0x1F;
		info->mulaw_table[i]  = (0x80 << s1) & 0xFF00;
		info->mulaw_table[i] += s2 << (s1 ? (s1+3) : 4);
		if (i & 0x80)
			info->mulaw_table[i] = -info->mulaw_table[i];
	}

	c140_set_mute_mask(info, 0x000000);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->sample_rate, &devDef);
	return 0x00;
}